

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O0

raw_sstring_view
pstore::get_unique_sstring_view
          (database *db,address addr,size_t length,
          not_null<pstore::sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>_*>
          owner)

{
  uint *puVar1;
  sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_> *this;
  sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_> *psVar2;
  const_pointer ptr;
  uint local_80;
  uint local_7c;
  address local_78;
  value_type local_70;
  address local_68;
  undefined1 local_60 [40];
  _Head_base<0UL,_pstore::region::factory_*,_false> local_38;
  size_t length_local;
  database *db_local;
  not_null<pstore::sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>_*> owner_local
  ;
  address addr_local;
  
  local_78.a_ = addr.a_;
  local_38._M_head_impl = (factory *)length;
  length_local = (size_t)db;
  db_local = (database *)owner.ptr_;
  owner_local.ptr_ = (sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_> *)addr.a_;
  local_7c = varint::encoded_size(length);
  local_80 = 2;
  puVar1 = std::max<unsigned_int>(&local_7c,&local_80);
  local_70 = (value_type)operator+(local_78,(ulong)*puVar1);
  local_68.a_ = (value_type)typed_address<char>::make((address)local_70);
  database::getrou<char,void>((database *)local_60,(typed_address<char>)db,local_68.a_);
  psVar2 = (sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_> *)(local_60 + 0x10);
  sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>::sstring_view
            (psVar2,(unique_ptr<const_char,_void_(*)(const_char_*)> *)local_60,
             (size_type)local_38._M_head_impl);
  this = gsl::not_null::operator_cast_to_sstring_view_((not_null *)&db_local);
  sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>::operator=(this,psVar2);
  sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>::~sstring_view(psVar2);
  std::unique_ptr<const_char,_void_(*)(const_char_*)>::~unique_ptr
            ((unique_ptr<const_char,_void_(*)(const_char_*)> *)local_60);
  psVar2 = gsl::
           not_null<pstore::sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>_*>::
           operator->((not_null<pstore::sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>_*>
                       *)&db_local);
  ptr = sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>::data(psVar2);
  sstring_view<const_char_*>::sstring_view
            ((sstring_view<const_char_*> *)&addr_local,ptr,(size_type)local_38._M_head_impl);
  return _addr_local;
}

Assistant:

raw_sstring_view
    get_unique_sstring_view (database const & db, address const addr, std::size_t const length,
                             gsl::not_null<unique_pointer_sstring_view *> const owner) {
        *owner = unique_pointer_sstring_view{
            db.getrou (
                typed_address<char>::make (addr + std::max (varint::encoded_size (length), 2U)),
                length),
            length};
        return {owner->data (), length};
    }